

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O0

int secp256k1_ec_pubkey_tweak_add_helper
              (secp256k1_ecmult_context *ecmult_ctx,secp256k1_ge *p,uchar *tweak)

{
  int iVar1;
  bool local_45;
  int local_44;
  undefined1 local_40 [4];
  int overflow;
  secp256k1_scalar term;
  uchar *tweak_local;
  secp256k1_ge *p_local;
  secp256k1_ecmult_context *ecmult_ctx_local;
  
  local_44 = 0;
  term.d[3] = (uint64_t)tweak;
  secp256k1_scalar_set_b32((secp256k1_scalar *)local_40,tweak,&local_44);
  local_45 = false;
  if (local_44 == 0) {
    iVar1 = secp256k1_eckey_pubkey_tweak_add(ecmult_ctx,p,(secp256k1_scalar *)local_40);
    local_45 = iVar1 != 0;
  }
  return (int)local_45;
}

Assistant:

static int secp256k1_ec_pubkey_tweak_add_helper(const secp256k1_ecmult_context* ecmult_ctx, secp256k1_ge *p, const unsigned char *tweak) {
    secp256k1_scalar term;
    int overflow = 0;
    secp256k1_scalar_set_b32(&term, tweak, &overflow);
    return !overflow && secp256k1_eckey_pubkey_tweak_add(ecmult_ctx, p, &term);
}